

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_proxy_base.hpp
# Opt level: O2

bool __thiscall
ranger::bhvr_tree::detail::
agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::expired_then_update
          (agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *this,decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                 *key,duration *dur)

{
  long lVar1;
  long lVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*const,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_bool>
  pVar3;
  time_point now;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *local_28;
  
  local_28 = key;
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  pVar3 = std::
          _Rb_tree<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*,std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::_Select1st<std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>,std::less<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*>,std::allocator<std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
          ::
          _M_emplace_unique<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*&,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&>
                    ((_Rb_tree<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*,std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::_Select1st<std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>,std::less<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*>,std::allocator<std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                      *)&this->m_time_points,&local_28,&local_30);
  lVar2 = (long)local_30.__d.__r - (long)pVar3.first._M_node._M_node[1]._M_parent;
  lVar1 = dur->__r;
  if (lVar1 <= lVar2) {
    pVar3.first._M_node._M_node[1]._M_parent = (_Base_ptr)local_30.__d.__r;
  }
  return lVar1 <= lVar2;
}

Assistant:

bool expired_then_update(const decorator_timer_node<AgentProxy>* key,
                           const typename Clock::duration& dur) {
    auto now = Clock::now();
    {
      std::lock_guard<Mutex> lock(m_time_points_mtx);

      auto it = m_time_points.emplace(key, now).first;
      if (now - it->second < dur) {
        return false;
      }

      it->second = now;
      return true;
    }
  }